

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionInfo::~AssertionInfo(AssertionInfo *this)

{
  AssertionInfo *this_local;
  
  std::__cxx11::string::~string((string *)&this->capturedExpression);
  SourceLineInfo::~SourceLineInfo(&this->lineInfo);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

AssertionInfo() {}